

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

char * str_sanitize_filename(char *aName)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  byte *pbVar5;
  char cVar6;
  ulong uVar7;
  bool bVar8;
  
  pcVar2 = aName;
  pbVar5 = (byte *)aName;
  do {
    bVar1 = *pbVar5;
    uVar7 = (ulong)bVar1;
    if (uVar7 < 0x40) {
      if ((0xd400840400000000U >> (uVar7 & 0x3f) & 1) == 0) {
        if (uVar7 == 0) {
          pcVar3 = aName + -1;
          do {
            pcVar4 = pcVar3 + 1;
            pcVar3 = pcVar3 + 1;
          } while (*pcVar4 == ' ');
          while( true ) {
            bVar8 = true;
            pcVar4 = pcVar3;
            while( true ) {
              pcVar3 = pcVar4 + 1;
              cVar6 = *pcVar4;
              if (cVar6 != ' ') break;
              bVar8 = false;
              pcVar4 = pcVar3;
            }
            if (cVar6 == '\0') break;
            if (!bVar8) {
              *aName = ' ';
              aName = aName + 1;
              cVar6 = *pcVar4;
            }
            *aName = cVar6;
            aName = aName + 1;
          }
          *aName = '\0';
          return pcVar2;
        }
        goto LAB_001d0c32;
      }
LAB_001d0c25:
      *pbVar5 = 0x20;
    }
    else {
LAB_001d0c32:
      if ((bVar1 == 0x5c) || (bVar1 == 0x7c)) goto LAB_001d0c25;
    }
    pbVar5 = pbVar5 + 1;
  } while( true );
}

Assistant:

char* str_sanitize_filename(char* aName)
{
	char *str = (char *)aName;
	while(*str)
	{
		// replace forbidden characters with a whispace
		if(*str == '/' || *str == '<' || *str == '>' || *str == ':' || *str == '"'
			|| *str == '/' || *str == '\\' || *str == '|' || *str == '?' || *str == '*')
 			*str = ' ';
		str++;
	}
	str_clean_whitespaces(aName);
	return aName;
}